

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O0

void test_cio_write_buffer_split_and_append_empty_list(void)

{
  size_t expected;
  size_t sVar1;
  cio_write_buffer *e;
  size_t size_before_append;
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  cio_write_buffer wbh_to_append;
  cio_write_buffer wbh_to_split;
  
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wbh_to_append.data + 8));
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wb1.data + 8));
  cio_write_buffer_const_element_init((cio_write_buffer *)((long)&wb2.data + 8),"HELLO",6);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1.data + 8),(cio_write_buffer *)((long)&wb2.data + 8));
  cio_write_buffer_const_element_init((cio_write_buffer *)&size_before_append,"World",6);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1.data + 8),(cio_write_buffer *)&size_before_append);
  expected = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb1.data + 8));
  cio_write_buffer_split_and_append
            ((cio_write_buffer *)((long)&wb1.data + 8),
             (cio_write_buffer *)((long)&wbh_to_append.data + 8),
             (cio_write_buffer *)((long)&wbh_to_append.data + 8));
  sVar1 = cio_write_buffer_get_num_buffer_elements
                    ((cio_write_buffer *)((long)&wbh_to_append.data + 8));
  UnityAssertEqualNumber
            (0,sVar1,"Number of elements in splitted list not correct!",0x17b,
             UNITY_DISPLAY_STYLE_INT);
  sVar1 = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wbh_to_append.data + 8));
  UnityAssertEqualNumber
            (0,sVar1,"Total size of splitted list not correct!",0x17c,UNITY_DISPLAY_STYLE_INT);
  sVar1 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)((long)&wb1.data + 8));
  UnityAssertEqualNumber
            (2,sVar1,"Number of elements in appended list not correct!",0x17d,
             UNITY_DISPLAY_STYLE_INT);
  sVar1 = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb1.data + 8));
  UnityAssertEqualNumber
            (expected,sVar1,"Total size of appended list not correct!",0x17e,UNITY_DISPLAY_STYLE_INT
            );
  return;
}

Assistant:

static void test_cio_write_buffer_split_and_append_empty_list(void)
{
	struct cio_write_buffer wbh_to_split;
	cio_write_buffer_head_init(&wbh_to_split);

	struct cio_write_buffer wbh_to_append;
	cio_write_buffer_head_init(&wbh_to_append);

	struct cio_write_buffer wb1;
	cio_write_buffer_const_element_init(&wb1, "HELLO", sizeof("HELLO"));
	cio_write_buffer_queue_tail(&wbh_to_append, &wb1);
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, "World", sizeof("World"));
	cio_write_buffer_queue_tail(&wbh_to_append, &wb2);
	size_t size_before_append = cio_write_buffer_get_total_size(&wbh_to_append);

	struct cio_write_buffer *e = &wbh_to_split;

	cio_write_buffer_split_and_append(&wbh_to_append, &wbh_to_split, e);
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_num_buffer_elements(&wbh_to_split), "Number of elements in splitted list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh_to_split), "Total size of splitted list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(2, cio_write_buffer_get_num_buffer_elements(&wbh_to_append), "Number of elements in appended list not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(size_before_append, cio_write_buffer_get_total_size(&wbh_to_append), "Total size of appended list not correct!");
}